

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cord_rep_flat.h
# Opt level: O3

CordRepFlat * absl::cord_internal::CordRepFlat::NewImpl<262144ul>(size_t len)

{
  size_t sVar1;
  CordRepFlat *pCVar2;
  sbyte sVar3;
  sbyte sVar4;
  char cVar5;
  long lVar6;
  byte bVar7;
  long lVar8;
  ulong uVar9;
  char cVar10;
  
  sVar1 = 0x3fff3;
  if (len < 0x3fff3) {
    sVar1 = len;
  }
  uVar9 = 0x20;
  if (0x13 < len) {
    uVar9 = sVar1 + 0xd;
  }
  lVar6 = 0x1000;
  if (uVar9 < 0x2001) {
    lVar6 = 0x40;
  }
  lVar8 = 8;
  if (0x200 < uVar9) {
    lVar8 = lVar6;
  }
  uVar9 = -lVar8 & (uVar9 + lVar8) - 1;
  pCVar2 = (CordRepFlat *)operator_new(uVar9);
  sVar4 = 0xc;
  if (uVar9 < 0x2001) {
    sVar4 = 6;
  }
  cVar10 = -0x48;
  if (uVar9 < 0x2001) {
    cVar10 = ':';
  }
  sVar3 = 3;
  if (0x200 < uVar9) {
    sVar3 = sVar4;
  }
  cVar5 = '\x02';
  if (0x200 < uVar9) {
    cVar5 = cVar10;
  }
  (pCVar2->super_CordRep).length = 0;
  (pCVar2->super_CordRep).refcount = (atomic<int>)0x0;
  (pCVar2->super_CordRep).tag = '\0';
  (pCVar2->super_CordRep).storage[0] = '\0';
  (pCVar2->super_CordRep).storage[1] = '\0';
  (pCVar2->super_CordRep).storage[2] = '\0';
  (pCVar2->super_CordRep).refcount.count_.super___atomic_base<int>._M_i = 2;
  bVar7 = (char)(uVar9 >> sVar3) + cVar5;
  if (bVar7 < 0xf9) {
    (pCVar2->super_CordRep).tag = bVar7;
    return pCVar2;
  }
  __assert_fail("tag <= MAX_FLAT_TAG",
                "/workspace/llm4binary/github/license_c_cmakelists/google[P]osqp-cpp/build_O3/_deps/abseil-cpp-src/absl/strings/internal/cord_rep_flat.h"
                ,0x5e,"uint8_t absl::cord_internal::AllocatedSizeToTag(size_t)");
}

Assistant:

static CordRepFlat* NewImpl(size_t len, Args... args ABSL_ATTRIBUTE_UNUSED) {
    if (len <= kMinFlatLength) {
      len = kMinFlatLength;
    } else if (len > max_flat_size - kFlatOverhead) {
      len = max_flat_size - kFlatOverhead;
    }

    // Round size up so it matches a size we can exactly express in a tag.
    const size_t size = RoundUpForTag(len + kFlatOverhead);
    void* const raw_rep = ::operator new(size);
    // GCC 13 has a false-positive -Wstringop-overflow warning here.
    #if ABSL_INTERNAL_HAVE_MIN_GNUC_VERSION(13, 0)
    #pragma GCC diagnostic push
    #pragma GCC diagnostic ignored "-Wstringop-overflow"
    #endif
    CordRepFlat* rep = new (raw_rep) CordRepFlat();
    rep->tag = AllocatedSizeToTag(size);
    #if ABSL_INTERNAL_HAVE_MIN_GNUC_VERSION(13, 0)
    #pragma GCC diagnostic pop
    #endif
    return rep;
  }